

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::String(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,Ch *str,SizeType length,bool copy)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  bool copy_local;
  SizeType length_local;
  Ch *str_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  if (copy) {
    pGVar1 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&this->stack_,1);
    allocator = GetAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(pGVar1,str,length,allocator);
  }
  else {
    pGVar1 = internal::Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                       (&this->stack_,1);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(pGVar1,str,length);
  }
  return true;
}

Assistant:

bool String(const Ch* str, SizeType length, bool copy) { 
        if (copy) 
            new (stack_.template Push<ValueType>()) ValueType(str, length, GetAllocator());
        else
            new (stack_.template Push<ValueType>()) ValueType(str, length);
        return true;
    }